

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PSocket.cpp
# Opt level: O2

void __thiscall P2PSocket::createServer(P2PSocket *this,string *ip,uint16_t port)

{
  SocketResource *this_00;
  Socket SVar1;
  SocketResource SVar2;
  int iVar3;
  long *plVar4;
  int *piVar5;
  char *pcVar6;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  sockaddr local_30;
  
  this_00 = &this->m_socket;
  SVar1 = SocketResource::resource(this_00);
  if (SVar1 != -1) {
    plVar4 = (long *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Socket server was already created\n",
               (allocator<char> *)&local_50);
    *plVar4 = (long)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      *(undefined4 *)(plVar4 + 2) = local_70.field_2._M_allocated_capacity._0_4_;
      *(undefined4 *)((long)plVar4 + 0x14) = local_70.field_2._M_allocated_capacity._4_4_;
      *(undefined4 *)(plVar4 + 3) = local_70.field_2._8_4_;
      *(undefined4 *)((long)plVar4 + 0x1c) = local_70.field_2._12_4_;
    }
    else {
      *plVar4 = (long)local_70._M_dataplus._M_p;
      plVar4[2] = CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                           local_70.field_2._M_allocated_capacity._0_4_);
    }
    plVar4[1] = local_70._M_string_length;
    local_70._M_string_length = 0;
    local_70.field_2._M_allocated_capacity._0_4_ =
         local_70.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    __cxa_throw(plVar4,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
  }
  if (port < 1000) {
    plVar4 = (long *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Invalid port\n",(allocator<char> *)&local_50);
    *plVar4 = (long)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      *(undefined4 *)(plVar4 + 2) = local_70.field_2._M_allocated_capacity._0_4_;
      *(undefined4 *)((long)plVar4 + 0x14) = local_70.field_2._M_allocated_capacity._4_4_;
      *(undefined4 *)(plVar4 + 3) = local_70.field_2._8_4_;
      *(undefined4 *)((long)plVar4 + 0x1c) = local_70.field_2._12_4_;
    }
    else {
      *plVar4 = (long)local_70._M_dataplus._M_p;
      plVar4[2] = CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                           local_70.field_2._M_allocated_capacity._0_4_);
    }
    plVar4[1] = local_70._M_string_length;
    local_70._M_string_length = 0;
    local_70.field_2._M_allocated_capacity._0_4_ =
         local_70.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    __cxa_throw(plVar4,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
  }
  local_30.sa_data[10] = '\0';
  local_30.sa_data[0xb] = '\0';
  local_30.sa_data[0xc] = '\0';
  local_30.sa_data[0xd] = '\0';
  local_30.sa_data[2] = '\0';
  local_30.sa_data[3] = '\0';
  local_30.sa_data[4] = '\0';
  local_30.sa_data[5] = '\0';
  local_30.sa_data[6] = '\0';
  local_30.sa_data[7] = '\0';
  local_30.sa_data[8] = '\0';
  local_30.sa_data[9] = '\0';
  local_30.sa_family = 2;
  local_30.sa_data._0_2_ = port << 8 | port >> 8;
  SVar2 = SocketResource::create();
  this_00->m_socket = SVar2.m_socket;
  SVar1 = SocketResource::resource(this_00);
  if (SVar1 == -1) {
    plVar4 = (long *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Failed to create socket\n",&local_71);
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    std::operator+(&local_70,&local_50,pcVar6);
    *plVar4 = (long)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      *(undefined4 *)(plVar4 + 2) = local_70.field_2._M_allocated_capacity._0_4_;
      *(undefined4 *)((long)plVar4 + 0x14) = local_70.field_2._M_allocated_capacity._4_4_;
      *(undefined4 *)(plVar4 + 3) = local_70.field_2._8_4_;
      *(undefined4 *)((long)plVar4 + 0x1c) = local_70.field_2._12_4_;
    }
    else {
      *plVar4 = (long)local_70._M_dataplus._M_p;
      plVar4[2] = CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                           local_70.field_2._M_allocated_capacity._0_4_);
    }
    plVar4[1] = local_70._M_string_length;
    local_70._M_string_length = 0;
    local_70.field_2._M_allocated_capacity._0_4_ =
         local_70.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    __cxa_throw(plVar4,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
  }
  if (ip->_M_string_length == 0) {
    local_30.sa_data._2_8_ = local_30.sa_data._2_8_ & 0xffffffff00000000;
  }
  else {
    iVar3 = inet_pton(2,(ip->_M_dataplus)._M_p,local_30.sa_data + 2);
    if (iVar3 < 1) {
      plVar4 = (long *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Invalid IPv4 host address\n",&local_71);
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      std::operator+(&local_70,&local_50,pcVar6);
      *plVar4 = (long)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        *(undefined4 *)(plVar4 + 2) = local_70.field_2._M_allocated_capacity._0_4_;
        *(undefined4 *)((long)plVar4 + 0x14) = local_70.field_2._M_allocated_capacity._4_4_;
        *(undefined4 *)(plVar4 + 3) = local_70.field_2._8_4_;
        *(undefined4 *)((long)plVar4 + 0x1c) = local_70.field_2._12_4_;
      }
      else {
        *plVar4 = (long)local_70._M_dataplus._M_p;
        plVar4[2] = CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                             local_70.field_2._M_allocated_capacity._0_4_);
      }
      plVar4[1] = local_70._M_string_length;
      local_70._M_string_length = 0;
      local_70.field_2._M_allocated_capacity._0_4_ =
           local_70.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      __cxa_throw(plVar4,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
    }
  }
  SVar1 = SocketResource::resource(this_00);
  iVar3 = bind(SVar1,&local_30,0x10);
  if (iVar3 != -1) {
    SVar1 = SocketResource::resource(this_00);
    iVar3 = ::listen(SVar1,this->m_maxPeers);
    if (-1 < iVar3) {
      return;
    }
    plVar4 = (long *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Failed to start listener",&local_71);
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    std::operator+(&local_70,&local_50,pcVar6);
    *plVar4 = (long)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      *(undefined4 *)(plVar4 + 2) = local_70.field_2._M_allocated_capacity._0_4_;
      *(undefined4 *)((long)plVar4 + 0x14) = local_70.field_2._M_allocated_capacity._4_4_;
      *(undefined4 *)(plVar4 + 3) = local_70.field_2._8_4_;
      *(undefined4 *)((long)plVar4 + 0x1c) = local_70.field_2._12_4_;
    }
    else {
      *plVar4 = (long)local_70._M_dataplus._M_p;
      plVar4[2] = CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                           local_70.field_2._M_allocated_capacity._0_4_);
    }
    plVar4[1] = local_70._M_string_length;
    local_70._M_string_length = 0;
    local_70.field_2._M_allocated_capacity._0_4_ =
         local_70.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    __cxa_throw(plVar4,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
  }
  plVar4 = (long *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Failed to bind\n",&local_71);
  piVar5 = __errno_location();
  pcVar6 = strerror(*piVar5);
  std::operator+(&local_70,&local_50,pcVar6);
  *plVar4 = (long)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) {
    *(undefined4 *)(plVar4 + 2) = local_70.field_2._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)plVar4 + 0x14) = local_70.field_2._M_allocated_capacity._4_4_;
    *(undefined4 *)(plVar4 + 3) = local_70.field_2._8_4_;
    *(undefined4 *)((long)plVar4 + 0x1c) = local_70.field_2._12_4_;
  }
  else {
    *plVar4 = (long)local_70._M_dataplus._M_p;
    plVar4[2] = CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                         local_70.field_2._M_allocated_capacity._0_4_);
  }
  plVar4[1] = local_70._M_string_length;
  local_70._M_string_length = 0;
  local_70.field_2._M_allocated_capacity._0_4_ =
       local_70.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  __cxa_throw(plVar4,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
}

Assistant:

void P2PSocket::createServer(const std::string &ip, uint16_t port)
{
    if (m_socket.resource() != -1) {
        throw P2PSocketException("Socket server was already created\n");
    }

    // validate port
    if (port < 0x3E8 || port > 0xFFFF) {
        throw P2PSocketException("Invalid port\n");
    }

    sockaddr_in address{};
    std::memset(&address, 0, sizeof address);
    address.sin_family = AF_INET;
    address.sin_port = htons(port);

    // save socket resource
    m_socket = SocketResource::create();
    if (m_socket.resource() == -1) {
        throw P2PSocketException(std::string{"Failed to create socket\n"} + std::strerror(errno));
    }

    // validate ip
    if (ip.empty()) {
        address.sin_addr.s_addr = INADDR_ANY;
    } else {
#ifdef _WIN32
        auto addr = ::inet_addr(ip.c_str());
        if (addr == INADDR_NONE)
            throw P2PSocketException("inet_addr failure: returned INADDR_NONE");
        if (addr == INADDR_ANY)
            throw P2PSocketException("inet_addr failure: returned INADDR_ANY");
        address.sin_addr.s_addr = addr;
#else
        if (::inet_pton(AF_INET, ip.c_str(), &address.sin_addr) <= 0)
            throw P2PSocketException(std::string{"Invalid IPv4 host address\n"} +
                                     std::strerror(errno));
#endif
    }

    if (::bind(m_socket.resource(), (struct sockaddr *)&address, sizeof(address)) == -1) {
        throw P2PSocketException(std::string{"Failed to bind\n"} + std::strerror(errno));
    }

    if (::listen(m_socket.resource(), m_maxPeers) < 0) {
        throw P2PSocketException(std::string{"Failed to start listener"} + std::strerror(errno));
    }
}